

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int r;
  int ret;
  int local_8;
  
  local_8 = 0;
  printf("testing SHAKE128x4 ...");
  iVar1 = test_shake128_x4();
  if (iVar1 == -2) {
    printf("SKIPPED\n");
  }
  else if (iVar1 == 0) {
    printf("OK\n");
  }
  else {
    printf("FAILED\n");
    local_8 = -1;
  }
  printf("testing SHAKE256x4 ...");
  iVar1 = test_shake256_x4();
  if (iVar1 == -2) {
    printf("SKIPPED\n");
  }
  else if (iVar1 == 0) {
    printf("OK\n");
  }
  else {
    printf("FAILED\n");
    local_8 = -1;
  }
  printf("testing SHAKE128 with valgrind ...");
  iVar1 = test_shake128_valgrind();
  if (iVar1 == -2) {
    printf("SKIPPED\n");
  }
  else if (iVar1 == 0) {
    printf("OK\n");
  }
  else {
    printf("FAILED\n");
    local_8 = -1;
  }
  return local_8;
}

Assistant:

int main(void) {
  int ret = 0;

  printf("testing SHAKE128x4 ...");
  int r = test_shake128_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE256x4 ...");
  r = test_shake256_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE128 with valgrind ...");
  r = test_shake128_valgrind();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  return ret;
}